

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcparam.c
# Opt level: O2

void jpeg_default_colorspace(j_compress_ptr cinfo)

{
  jpeg_error_mgr *pjVar1;
  J_COLOR_SPACE JStack_8;
  
  switch(cinfo->in_color_space) {
  case JCS_UNKNOWN:
    jpeg_set_colorspace(cinfo,JCS_UNKNOWN);
    return;
  case JCS_GRAYSCALE:
    JStack_8 = JCS_GRAYSCALE;
    break;
  case JCS_RGB:
  case JCS_YCbCr:
    JStack_8 = JCS_YCbCr;
    break;
  case JCS_CMYK:
    JStack_8 = JCS_CMYK;
    break;
  case JCS_YCCK:
    JStack_8 = JCS_YCCK;
    break;
  default:
    pjVar1 = cinfo->err;
    pjVar1->msg_code = 10;
    (*pjVar1->error_exit)((j_common_ptr)cinfo);
    return;
  }
  jpeg_set_colorspace(cinfo,JStack_8);
  return;
}

Assistant:

GLOBAL(void)
jpeg_default_colorspace (j_compress_ptr cinfo)
{
  switch (cinfo->in_color_space) {
  case JCS_GRAYSCALE:
    jpeg_set_colorspace(cinfo, JCS_GRAYSCALE);
    break;
  case JCS_RGB:
    jpeg_set_colorspace(cinfo, JCS_YCbCr);
    break;
  case JCS_YCbCr:
    jpeg_set_colorspace(cinfo, JCS_YCbCr);
    break;
  case JCS_CMYK:
    jpeg_set_colorspace(cinfo, JCS_CMYK); /* By default, no translation */
    break;
  case JCS_YCCK:
    jpeg_set_colorspace(cinfo, JCS_YCCK);
    break;
  case JCS_UNKNOWN:
    jpeg_set_colorspace(cinfo, JCS_UNKNOWN);
    break;
  default:
    ERREXIT(cinfo, JERR_BAD_IN_COLORSPACE);
  }
}